

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTable::childAt(QAccessibleTable *this,int x,int y)

{
  bool bVar1;
  int iVar2;
  QWidget *this_00;
  QPoint *p2;
  QWidget *this_01;
  QAbstractItemView *pQVar3;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  QModelIndex index;
  QPoint indexPosition;
  QPoint viewportOffset;
  undefined8 in_stack_ffffffffffffff78;
  QAbstractScrollArea *in_stack_ffffffffffffff80;
  QPoint *in_stack_ffffffffffffff90;
  QAccessibleTable *this_02;
  QAccessibleInterface *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QPoint local_28;
  QPoint local_20 [2];
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = in_RDI;
  view((QAccessibleTable *)0x7f55f4);
  this_00 = QAbstractScrollArea::viewport(in_stack_ffffffffffffff80);
  p2 = (QPoint *)view((QAccessibleTable *)0x7f560b);
  QPoint::QPoint((QPoint *)this_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (int)in_stack_ffffffffffffff78);
  local_10 = QWidget::mapTo((QWidget *)CONCAT44(in_ESI,in_EDX),(QWidget *)in_RDI,
                            in_stack_ffffffffffffff90);
  local_20[0] = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QWidget *)view((QAccessibleTable *)0x7f564d);
  QPoint::QPoint((QPoint *)this_00,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (int)in_stack_ffffffffffffff78);
  local_28 = ::operator-((QPoint *)this_01,p2);
  local_20[0] = QWidget::mapFromGlobal(this_01,p2);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = view((QAccessibleTable *)0x7f56ba);
  (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1f0))
            (&local_48,pQVar3,local_20);
  bVar1 = QModelIndex::isValid((QModelIndex *)this_00);
  if (bVar1) {
    iVar2 = logicalIndex(this_02,(QModelIndex *)CONCAT44(in_ESI,in_EDX));
    local_50 = (QAccessibleInterface *)(**(code **)(*(long *)in_RDI + 0x100))(in_RDI,iVar2);
  }
  else {
    local_50 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTable::childAt(int x, int y) const
{
    QPoint viewportOffset = view()->viewport()->mapTo(view(), QPoint(0,0));
    QPoint indexPosition = view()->mapFromGlobal(QPoint(x, y) - viewportOffset);
    // FIXME: if indexPosition < 0 in one coordinate, return header

    const QModelIndex index = view()->indexAt(indexPosition);
    if (index.isValid())
        return child(logicalIndex(index));
    return nullptr;
}